

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall DACSThinker::StopScriptsFor(DACSThinker *this,AActor *actor)

{
  DLevelScript *pDVar1;
  bool bVar2;
  DLevelScript *next;
  DLevelScript *script;
  AActor *actor_local;
  DACSThinker *this_local;
  
  pDVar1 = this->Scripts;
  while (next = pDVar1, next != (DLevelScript *)0x0) {
    pDVar1 = next->next;
    bVar2 = TObjPtr<AActor>::operator==(&next->activator,actor);
    if (bVar2) {
      DLevelScript::SetState(next,SCRIPT_PleaseRemove);
    }
  }
  return;
}

Assistant:

void DACSThinker::StopScriptsFor (AActor *actor)
{
	DLevelScript *script = Scripts;

	while (script != NULL)
	{
		DLevelScript *next = script->next;
		if (script->activator == actor)
		{
			script->SetState (DLevelScript::SCRIPT_PleaseRemove);
		}
		script = next;
	}
}